

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_nested
          (basic_substring<const_char> *this,CC open,CC close)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  undefined7 in_register_00000011;
  long lVar5;
  size_t start;
  ulong uVar6;
  ro_substr chars;
  ro_substr chars_00;
  basic_substring<const_char> bVar7;
  char both [3];
  CC local_53;
  CC local_52;
  undefined1 local_51;
  ulong local_50;
  undefined4 local_44;
  basic_substring<const_char> local_40;
  
  local_50 = first_of(this,open,0);
  if (local_50 != 0xffffffffffffffff) {
    start = local_50 + 1;
    local_51 = 0;
    chars.len = 2;
    chars.str = &local_53;
    local_53 = open;
    local_52 = close;
    sVar4 = first_of(this,chars,start);
    if (sVar4 == 0xffffffffffffffff) {
      local_40.len = 0;
      local_40.str = (char *)0x0;
      goto LAB_00239620;
    }
    local_44 = (undefined4)CONCAT71(in_register_00000011,close);
    lVar5 = 0;
    do {
      if (this->str[sVar4] == open) {
        lVar5 = lVar5 + 1;
LAB_002395a9:
        start = sVar4 + 1;
      }
      else if (this->str[sVar4] == (char)local_44) {
        if (lVar5 != 0) {
          lVar5 = lVar5 + -1;
          goto LAB_002395a9;
        }
        uVar1 = this->len;
        if (uVar1 < local_50) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            bVar7 = (basic_substring<const_char>)(*pcVar2)();
            return bVar7;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar6 = sVar4 + 1;
        if (sVar4 + 1 == 0xffffffffffffffff) {
          uVar6 = uVar1;
        }
        if (uVar6 < local_50) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            bVar7 = (basic_substring<const_char>)(*pcVar2)();
            return bVar7;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar1 < uVar6) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            bVar7 = (basic_substring<const_char>)(*pcVar2)();
            return bVar7;
          }
          handle_error(0x24bbea,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring(&local_40,this->str + local_50,uVar6 - local_50);
        goto LAB_00239620;
      }
      chars_00.len = 2;
      chars_00.str = &local_53;
      sVar4 = first_of(this,chars_00,start);
    } while (sVar4 != 0xffffffffffffffff);
  }
  local_40.str = (char *)0x0;
  local_40.len = 0;
LAB_00239620:
  bVar7.len = local_40.len;
  bVar7.str = local_40.str;
  return bVar7;
}

Assistant:

basic_substring pair_range_nested(CC open, CC close) const
    {
        size_t b = find(open);
        if(b == npos) return basic_substring();
        size_t e, curr = b+1, count = 0;
        const char both[] = {open, close, '\0'};
        while((e = first_of(both, curr)) != npos)
        {
            if(str[e] == open)
            {
                ++count;
                curr = e+1;
            }
            else if(str[e] == close)
            {
                if(count == 0) return range(b, e+1);
                --count;
                curr = e+1;
            }
        }
        return basic_substring();
    }